

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_DriverCallback::OnPhaseChange
          (RS_DriverCallback *this,Phase old_phase,Phase new_phase)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  
  if (new_phase == HOLD) {
    lVar1 = (**(code **)(**(long **)(*(long *)&(((this->m_robot->m_limbs).
                                                 super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[3].
                                                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_wheel).
                                               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                    + 0x28) + 0x1f0))();
    lVar2 = (**(code **)(**(long **)(*(long *)&(((((this->m_robot->m_limbs).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->m_wheel).
                                               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                    + 0x28) + 0x1f0))();
    lVar3 = (**(code **)(**(long **)(*(long *)&(((this->m_robot->m_limbs).
                                                 super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[2].
                                                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_wheel).
                                               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                    + 0x28) + 0x1f0))();
    lVar4 = (**(code **)(**(long **)(*(long *)&(((this->m_robot->m_limbs).
                                                 super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_wheel).
                                               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                    + 0x28) + 0x1f0))();
    std::operator<<((ostream *)&std::cout,"  wheel FL: ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 8));
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x10));
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"  wheel FR: ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar2 + 8));
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar2 + 0x10));
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"  wheel RL: ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar3 + 8));
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar3 + 0x10));
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"  wheel RR: ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 8));
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar4 + 0x10));
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  if (old_phase != CYCLE && new_phase == CYCLE) {
    lVar1 = (**(code **)(*(long *)(((this->m_robot->m_chassis).
                                    super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_RS_Part).m_body.
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x1f0))();
    this->m_start_x = *(double *)(lVar1 + 8);
    this->m_start_time = *(double *)(this->m_robot->m_system + 0x1a8);
  }
  return;
}

Assistant:

void RS_DriverCallback::OnPhaseChange(RS_Driver::Phase old_phase, RS_Driver::Phase new_phase) {
    if (new_phase == RS_Driver::HOLD) {
        auto& fl = m_robot->GetWheelPos(FL);
        auto& fr = m_robot->GetWheelPos(FR);
        auto& rl = m_robot->GetWheelPos(RL);
        auto& rr = m_robot->GetWheelPos(RR);
        std::cout << "  wheel FL: " << fl.x() << "  " << fl.y() << std::endl;
        std::cout << "  wheel FR: " << fr.x() << "  " << fr.y() << std::endl;
        std::cout << "  wheel RL: " << rl.x() << "  " << rl.y() << std::endl;
        std::cout << "  wheel RR: " << rr.x() << "  " << rr.y() << std::endl;
    }
    if (new_phase == RS_Driver::CYCLE && old_phase != RS_Driver::CYCLE) {
        m_start_x = m_robot->GetChassisPos().x();
        m_start_time = m_robot->GetSystem()->GetChTime();
    }
}